

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O3

LY_ERR lyb_read_start_siblings(lylyb_ctx *lybctx)

{
  long *plVar1;
  long lVar2;
  lyd_lyb_sibling *plVar3;
  uint64_t uVar4;
  uint8_t meta_buf [4];
  ushort local_1c;
  uint16_t local_1a;
  
  plVar3 = lybctx->siblings;
  if (plVar3 == (lyd_lyb_sibling *)0x0) {
    plVar1 = (long *)calloc(1,0x68);
    if (plVar1 == (long *)0x0) {
LAB_00139468:
      ly_log(lybctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyb_read_start_siblings");
      return LY_EMEM;
    }
    lVar2 = 0;
    uVar4 = 0;
  }
  else {
    uVar4 = *(uint64_t *)&plVar3[-1].inner_chunks;
    if (uVar4 != lybctx->sibling_size) goto LAB_0013941d;
    plVar1 = (long *)realloc(&plVar3[-1].inner_chunks,uVar4 * 0x30 + 0x68);
    if (plVar1 == (long *)0x0) goto LAB_00139468;
    lVar2 = *plVar1;
  }
  plVar3 = (lyd_lyb_sibling *)(plVar1 + 1);
  lybctx->siblings = plVar3;
  memset(plVar1 + lVar2 * 3 + 1,0,uVar4 * 0x18 + 0x60);
  lybctx->sibling_size = uVar4 + 4;
LAB_0013941d:
  lVar2 = *(long *)&plVar3[-1].inner_chunks;
  *(long *)&plVar3[-1].inner_chunks = lVar2 + 1;
  ly_in_read(lybctx->in,&local_1c,4);
  plVar3[lVar2].written = (ulong)local_1c;
  plVar3[lVar2].inner_chunks = local_1a;
  plVar3[lVar2].position = (ulong)((ulong)local_1c == 0xffff);
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyb_read_start_siblings(struct lylyb_ctx *lybctx)
{
    LY_ARRAY_COUNT_TYPE u;

    u = LY_ARRAY_COUNT(lybctx->siblings);
    if (u == lybctx->sibling_size) {
        LY_ARRAY_CREATE_RET(lybctx->ctx, lybctx->siblings, u + LYB_SIBLING_STEP, LY_EMEM);
        lybctx->sibling_size = u + LYB_SIBLING_STEP;
    }

    LY_ARRAY_INCREMENT(lybctx->siblings);
    lyb_read_sibling_meta(&LYB_LAST_SIBLING(lybctx), lybctx);

    return LY_SUCCESS;
}